

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

GLboolean __thiscall
glcts::TextureBufferOperations::verifyResults
          (TextureBufferOperations *this,GLint *reference,GLint *result,GLuint size,char *message)

{
  ostringstream *this_00;
  GLboolean GVar1;
  int iVar2;
  ostream *poVar3;
  GLuint i;
  ulong uVar4;
  stringstream referenceData;
  stringstream resultData;
  string local_500 [32];
  string local_4e0 [32];
  stringstream local_4c0 [16];
  ostream local_4b0;
  stringstream local_338 [16];
  ostream local_328;
  undefined1 local_1b0 [384];
  
  iVar2 = bcmp(reference,result,(ulong)size);
  if (iVar2 == 0) {
    GVar1 = '\x01';
  }
  else {
    std::__cxx11::stringstream::stringstream(local_4c0);
    std::__cxx11::stringstream::stringstream(local_338);
    std::operator<<(&local_4b0,"[");
    std::operator<<(&local_328,"[");
    for (uVar4 = 0; size >> 2 != uVar4; uVar4 = uVar4 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(&local_4b0,reference[uVar4]);
      std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(&local_328,result[uVar4]);
      std::operator<<(poVar3,",");
    }
    std::operator<<(&local_4b0,"]");
    std::operator<<(&local_328,"]");
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,message);
    std::operator<<((ostream *)this_00,
                    "Result buffer contains different data than reference buffer\n");
    std::operator<<((ostream *)this_00,"Reference Buffer: ");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this_00,local_4e0);
    std::operator<<((ostream *)this_00,"\n");
    std::operator<<((ostream *)this_00,"Result Buffer: ");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this_00,local_500);
    std::operator<<((ostream *)this_00,"\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_500);
    std::__cxx11::string::~string(local_4e0);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::__cxx11::stringstream::~stringstream(local_338);
    std::__cxx11::stringstream::~stringstream(local_4c0);
    GVar1 = '\0';
  }
  return GVar1;
}

Assistant:

glw::GLboolean TextureBufferOperations::verifyResults(glw::GLint* reference, glw::GLint* result, glw::GLuint size,
													  const char* message)
{
	/* Log error if expected and result data is not equal */
	if (memcmp(reference, result, size))
	{
		std::stringstream referenceData;
		std::stringstream resultData;

		referenceData << "[";
		resultData << "[";

		glw::GLuint n_entries = static_cast<glw::GLuint>(size / sizeof(glw::GLint));

		for (glw::GLuint i = 0; i < n_entries; ++i)
		{
			referenceData << reference[i] << ",";
			resultData << result[i] << ",";
		}

		referenceData << "]";
		resultData << "]";

		m_testCtx.getLog() << tcu::TestLog::Message << message
						   << "Result buffer contains different data than reference buffer\n"
						   << "Reference Buffer: " << referenceData.str() << "\n"
						   << "Result Buffer: " << resultData.str() << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}